

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SyntaxClone.cpp
# Opt level: O0

int slang::syntax::deep::clone(__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  GenerateRegionSyntax *pGVar1;
  Token *unaff_retaddr;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000008;
  BumpAllocator *in_stack_00000010;
  BumpAllocator *in_stack_00000068;
  SyntaxList<slang::syntax::AttributeInstanceSyntax> *in_stack_00000070;
  BumpAllocator *in_stack_00000108;
  Token *in_stack_00000110;
  
  deepClone<slang::syntax::AttributeInstanceSyntax>(in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  deepClone<slang::syntax::MemberSyntax>
            ((SyntaxList<slang::syntax::MemberSyntax> *)in_stack_00000070,in_stack_00000068);
  parsing::Token::deepClone(in_stack_00000110,in_stack_00000108);
  pGVar1 = BumpAllocator::
           emplace<slang::syntax::GenerateRegionSyntax,slang::syntax::SyntaxList<slang::syntax::AttributeInstanceSyntax>&,slang::parsing::Token,slang::syntax::SyntaxList<slang::syntax::MemberSyntax>&,slang::parsing::Token>
                     (in_stack_00000010,in_stack_00000008,unaff_retaddr,
                      (SyntaxList<slang::syntax::MemberSyntax> *)__fn,(Token *)__child_stack);
  return (int)pGVar1;
}

Assistant:

static SyntaxNode* clone(const GenerateRegionSyntax& node, BumpAllocator& alloc) {
    return alloc.emplace<GenerateRegionSyntax>(
        *deepClone(node.attributes, alloc),
        node.keyword.deepClone(alloc),
        *deepClone(node.members, alloc),
        node.endgenerate.deepClone(alloc)
    );
}